

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThriftSenderTest.cpp
# Opt level: O3

void __thiscall
jaegertracing::ThriftSender_testManyMessages_Test::TestBody
          (ThriftSender_testManyMessages_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint64_t *puVar3;
  string_view name;
  char cVar4;
  UDPTransporter *this_00;
  long *plVar5;
  uint64_t *puVar6;
  uint __val;
  uint __len;
  string __str;
  long *local_368;
  UDPTransporter *local_360;
  shared_ptr<const_jaegertracing::Tracer> tracer;
  time_point local_348;
  time_point local_340;
  shared_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle> handle;
  vector<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_> local_328;
  vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> local_308;
  SpanContext local_2e8;
  ThriftSender sender;
  Span span;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_198;
  
  jaegertracing::testutils::TracerUtil::installGlobalTracer();
  opentracing::v3::Tracer::Global();
  tracer.super___shared_ptr<const_jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = _span;
  tracer.super___shared_ptr<const_jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = local_198;
  if (local_198 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_198->_M_use_count = local_198->_M_use_count + 1;
      UNLOCK();
      if (local_198 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00197a78;
    }
    else {
      local_198->_M_use_count = local_198->_M_use_count + 1;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_198);
  }
LAB_00197a78:
  this_00 = (UDPTransporter *)operator_new(0xc0);
  memcpy((IPAddress *)&span,
         (void *)(*(long *)handle.
                           super___shared_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr + 0x30),0x88);
  jaegertracing::utils::UDPTransporter::UDPTransporter(this_00,(IPAddress *)&span,0);
  local_360 = this_00;
  jaegertracing::ThriftSender::ThriftSender(&sender,(unique_ptr *)&local_360);
  jaegertracing::logging::consoleLogger();
  paVar2 = &local_2e8._debugID.field_2;
  paVar1 = &__str.field_2;
  __val = 0;
  while( true ) {
    local_2e8.super_SpanContext._vptr_SpanContext = (_func_int **)&PTR__SpanContext_0020a2e8;
    local_2e8._flags = '\0';
    local_2e8._spanID = 0;
    local_2e8._parentID = 0;
    local_2e8._traceID._high = 0;
    local_2e8._traceID._low = 0;
    local_2e8._baggage._M_h._M_buckets = &local_2e8._baggage._M_h._M_single_bucket;
    local_2e8._baggage._M_h._M_bucket_count = 1;
    local_2e8._baggage._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_2e8._baggage._M_h._M_element_count = 0;
    local_2e8._baggage._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    local_2e8._baggage._M_h._M_rehash_policy._M_next_resize = 0;
    local_2e8._baggage._M_h._M_single_bucket = (__node_base_ptr)0x0;
    local_2e8._debugID._M_string_length = 0;
    local_2e8._debugID.field_2._M_local_buf[0] = '\0';
    local_2e8._mutex.super___mutex_base._M_mutex.__data.__list.__next =
         (__pthread_internal_list *)0x0;
    local_2e8._mutex.super___mutex_base._M_mutex._16_8_ = 0;
    local_2e8._mutex.super___mutex_base._M_mutex.__data.__list.__prev =
         (__pthread_internal_list *)0x0;
    local_2e8._mutex.super___mutex_base._M_mutex.__align = 0;
    local_2e8._mutex.super___mutex_base._M_mutex._8_8_ = 0;
    __str._M_dataplus._M_p = (pointer)paVar1;
    local_2e8._debugID._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&__str,"");
    local_340.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    local_348.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    local_308.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_308.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_308.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_328.
    super__Vector_base<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_328.
    super__Vector_base<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_328.
    super__Vector_base<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    Span::Span(&span,&tracer,&local_2e8,&__str,&local_340,&local_348,&local_308,&local_328);
    std::vector<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>::~vector
              (&local_328);
    std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector(&local_308);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != paVar1) {
      operator_delete(__str._M_dataplus._M_p);
    }
    local_2e8.super_SpanContext._vptr_SpanContext = (_func_int **)&PTR__SpanContext_0020a2e8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._debugID._M_dataplus._M_p != paVar2) {
      operator_delete(local_2e8._debugID._M_dataplus._M_p);
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_2e8._baggage._M_h);
    __len = 1;
    if ((9 < __val) && (__len = 2, 99 < __val)) {
      __len = 4 - (__val < 1000);
    }
    __str._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&__str,(char)__len);
    std::__detail::__to_chars_10_impl<unsigned_int>(__str._M_dataplus._M_p,__len,__val);
    plVar5 = (long *)std::__cxx11::string::replace((ulong)&__str,0,(char *)0x0,0x1d708d);
    puVar3 = &local_2e8._traceID._low;
    puVar6 = (uint64_t *)(plVar5 + 2);
    if ((uint64_t *)*plVar5 == puVar6) {
      local_2e8._traceID._low = *puVar6;
      local_2e8._spanID = plVar5[3];
      local_2e8.super_SpanContext._vptr_SpanContext = (_func_int **)puVar3;
    }
    else {
      local_2e8._traceID._low = *puVar6;
      local_2e8.super_SpanContext._vptr_SpanContext = (_func_int **)*plVar5;
    }
    local_2e8._traceID._high = plVar5[1];
    *plVar5 = (long)puVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    name.length_ = local_2e8._traceID._high;
    name.data_ = (char *)local_2e8.super_SpanContext._vptr_SpanContext;
    Span::SetOperationName(&span,name);
    if (local_2e8.super_SpanContext._vptr_SpanContext != (_func_int **)puVar3) {
      operator_delete(local_2e8.super_SpanContext._vptr_SpanContext);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != paVar1) {
      operator_delete(__str._M_dataplus._M_p);
    }
    cVar4 = testing::internal::AlwaysTrue();
    if (cVar4 == '\0') break;
    cVar4 = testing::internal::AlwaysTrue();
    if (cVar4 != '\0') {
      jaegertracing::ThriftSender::append((Span *)&sender);
    }
    Span::~Span(&span);
    __val = __val + 1;
    if (__val == 2000) {
LAB_00197ef7:
      if (local_368 != (long *)0x0) {
        (**(code **)(*local_368 + 8))();
      }
      ThriftSender::~ThriftSender(&sender);
      if (local_360 != (UDPTransporter *)0x0) {
        (*(local_360->super_Transport)._vptr_Transport[1])();
      }
      if (tracer.super___shared_ptr<const_jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (tracer.
                   super___shared_ptr<const_jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (handle.
          super___shared_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (handle.
                   super___shared_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      return;
    }
  }
  testing::Message::Message((Message *)&local_2e8);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&__str,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/ThriftSenderTest.cpp"
             ,0x54,
             "Expected: sender.append(span) doesn\'t throw an exception.\n  Actual: it throws.");
  testing::internal::AssertHelper::operator=((AssertHelper *)&__str,(Message *)&local_2e8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&__str);
  if (((local_2e8.super_SpanContext._vptr_SpanContext != (_func_int **)0x0) &&
      (cVar4 = testing::internal::IsTrue(true), cVar4 != '\0')) &&
     (local_2e8.super_SpanContext._vptr_SpanContext != (_func_int **)0x0)) {
    (**(code **)(*local_2e8.super_SpanContext._vptr_SpanContext + 8))();
  }
  Span::~Span(&span);
  goto LAB_00197ef7;
}

Assistant:

TEST(ThriftSender, testManyMessages)
{
    const auto handle = testutils::TracerUtil::installGlobalTracer();
    const auto tracer =
        std::static_pointer_cast<const Tracer>(opentracing::Tracer::Global());

    std::unique_ptr<utils::Transport> transporter(
        new utils::UDPTransporter(handle->_mockAgent->spanServerAddress(), 0));
    ThriftSender sender(
        std::forward<std::unique_ptr<utils::Transport>>(transporter));
    constexpr auto kNumMessages = 2000;
    const auto logger = logging::consoleLogger();
    for (auto i = 0; i < kNumMessages; ++i) {
        Span span(tracer);
        span.SetOperationName("test" + std::to_string(i));
        ASSERT_NO_THROW(sender.append(span));
    }
}